

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_jpeg.h
# Opt level: O0

int tje_encode_to_file(char *dest_path,int width,int height,int num_components,_Bool Rgb,
                      uchar *src_data)

{
  uchar uVar1;
  uchar *src_data_00;
  int res_1;
  int res;
  int x;
  uchar *outLine;
  uchar *inLine;
  int y;
  uchar *dst_data;
  uchar *src_data_local;
  _Bool Rgb_local;
  int num_components_local;
  int height_local;
  int width_local;
  char *dest_path_local;
  
  if (num_components == 1) {
    src_data_00 = (uchar *)malloc((long)(width * height * 3));
    if (src_data_00 == (uchar *)0x0) {
      dest_path_local._4_4_ = 0;
    }
    else {
      for (inLine._4_4_ = 0; inLine._4_4_ < height; inLine._4_4_ = inLine._4_4_ + 1) {
        _res = src_data_00 + inLine._4_4_ * width * 3;
        for (res_1 = 0; res_1 < width; res_1 = res_1 + 1) {
          uVar1 = src_data[(long)res_1 + (long)(inLine._4_4_ * width)];
          _res[2] = uVar1;
          _res[1] = uVar1;
          *_res = uVar1;
          _res = _res + 3;
        }
      }
      dest_path_local._4_4_ =
           tje_encode_to_file_at_quality(dest_path,3,width,height,3,Rgb,src_data_00);
      free(src_data_00);
    }
  }
  else {
    dest_path_local._4_4_ =
         tje_encode_to_file_at_quality(dest_path,3,width,height,num_components,Rgb,src_data);
  }
  return dest_path_local._4_4_;
}

Assistant:

int tje_encode_to_file(const char* dest_path,
                       const int width,
                       const int height,
                       const int num_components,
					   bool Rgb,
                       const unsigned char* src_data)
{
	if (num_components == 1)
	{
		unsigned char*  dst_data = (unsigned char*)malloc(width*height * 3);
		if (dst_data == NULL) return 0;
		for (int y = 0; y < height; y++)
		{
			const unsigned char*     inLine = src_data + (y * width);
			unsigned char*     outLine = dst_data + (y * width * 3);

			for (int x = 0; x < width; x++)
			{
				outLine[0] = outLine[1] = outLine[2] = inLine[x];

				outLine += 3;
			}
		}
		int res = tje_encode_to_file_at_quality(dest_path, 3, width, height, 3,  Rgb, dst_data);
		free(dst_data);
		return res;
	}
	else
	{ 
		int res = tje_encode_to_file_at_quality(dest_path, 3, width, height, num_components, Rgb, src_data);
		return res;
	}
}